

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_parse.c
# Opt level: O1

ngx_int_t ngx_parse_time(ngx_str_t *line,ngx_uint_t is_sec)

{
  bool bVar1;
  bool bVar2;
  byte bVar3;
  ulong uVar4;
  ngx_int_t nVar5;
  byte *pbVar6;
  byte *pbVar7;
  long lVar8;
  long lVar9;
  byte *pbVar10;
  byte bVar11;
  long lVar12;
  
  if ((long)line->len < 1) {
    bVar2 = true;
    lVar9 = 0;
    lVar12 = 0;
  }
  else {
    pbVar6 = line->data;
    pbVar10 = pbVar6 + line->len;
    bVar11 = (is_sec == 0) * '\x02';
    bVar2 = false;
    lVar9 = 0;
    do {
      bVar3 = *pbVar6;
      if ((byte)(bVar3 - 0x30) < 10) {
        lVar12 = 0;
        do {
          pbVar6 = pbVar6 + 1;
          if (0xccccccccccccccb < lVar12) {
            if (lVar12 != 0xccccccccccccccc) {
              return -1;
            }
            if ((bVar3 & 8) != 0) {
              return -1;
            }
          }
          lVar12 = (ulong)bVar3 + lVar12 * 10 + -0x30;
          if (pbVar10 <= pbVar6) {
            bVar2 = false;
            goto LAB_0011892a;
          }
          bVar3 = *pbVar6;
        } while ((byte)(bVar3 - 0x30) < 10);
        bVar2 = true;
      }
      else {
        lVar12 = 0;
      }
      pbVar7 = pbVar6 + 1;
      if (bVar3 < 0x6d) {
        if (bVar3 < 100) {
          if (bVar3 == 0x20) {
            if (6 < bVar11) {
              return -1;
            }
            bVar11 = 9;
LAB_001187ea:
            lVar8 = 1;
            bVar1 = false;
            uVar4 = 0x7fffffffffffffff;
          }
          else {
            if (bVar3 != 0x4d) {
              return -1;
            }
            if (1 < bVar11) {
              return -1;
            }
            bVar11 = 2;
            lVar8 = 0x278d00;
            bVar1 = false;
            uVar4 = 0x33c812681e8;
          }
        }
        else if (bVar3 == 100) {
          if (3 < bVar11) {
            return -1;
          }
          bVar11 = 4;
          lVar8 = 0x15180;
          bVar1 = false;
          uVar4 = 0x611722833944;
        }
        else {
          if (bVar3 != 0x68) {
            return -1;
          }
          if (4 < bVar11) {
            return -1;
          }
          bVar11 = 5;
          lVar8 = 0xe10;
          bVar1 = false;
          uVar4 = 0x91a2b3c4d5e6f;
        }
      }
      else if (bVar3 < 0x77) {
        if (bVar3 != 0x6d) {
          if (bVar3 != 0x73) {
            return -1;
          }
          if (6 < bVar11) {
            return -1;
          }
          bVar11 = 7;
          goto LAB_001187ea;
        }
        if ((pbVar7 < pbVar10) && (*pbVar7 == 0x73)) {
          if (is_sec != 0) {
            return -1;
          }
          if (7 < bVar11) {
            return -1;
          }
          pbVar7 = pbVar6 + 2;
          bVar11 = 8;
          bVar1 = true;
          lVar8 = 1;
          uVar4 = 0x7fffffffffffffff;
        }
        else {
          if (5 < bVar11) {
            return -1;
          }
          bVar11 = 6;
          lVar8 = 0x3c;
          bVar1 = false;
          uVar4 = 0x222222222222222;
        }
      }
      else if (bVar3 == 0x77) {
        if (2 < bVar11) {
          return -1;
        }
        bVar11 = 3;
        lVar8 = 0x93a80;
        bVar1 = false;
        uVar4 = 0xddebbc99a77;
      }
      else {
        if (bVar3 != 0x79) {
          return -1;
        }
        if (bVar11 != 0) {
          return -1;
        }
        bVar11 = 1;
        lVar8 = 0x1e13380;
        bVar1 = false;
        uVar4 = 0x4418a47ae5;
      }
      if (is_sec == 0 && !bVar1) {
        lVar8 = lVar8 * 1000;
        uVar4 = uVar4 / 1000;
      }
      if ((long)uVar4 < lVar12) {
        return -1;
      }
      pbVar6 = pbVar7;
      if (0x7fffffffffffffff - lVar8 * lVar12 < lVar9) {
        return -1;
      }
      for (; (pbVar6 < pbVar10 && (*pbVar6 == 0x20)); pbVar6 = pbVar6 + 1) {
      }
      lVar9 = lVar8 * lVar12 + lVar9;
    } while (pbVar6 < pbVar10);
    bVar2 = !bVar2;
    lVar12 = 0;
  }
LAB_0011892a:
  nVar5 = -1;
  if (!bVar2) {
    if (is_sec == 0) {
      if (0x20c49ba5e353f7 < lVar12) {
        return -1;
      }
      lVar12 = lVar12 * 1000;
    }
    if (lVar9 <= 0x7fffffffffffffff - lVar12) {
      nVar5 = lVar12 + lVar9;
    }
  }
  return nVar5;
}

Assistant:

ngx_int_t
ngx_parse_time(ngx_str_t *line, ngx_uint_t is_sec)
{
    u_char      *p, *last;
    ngx_int_t    value, total, scale;
    ngx_int_t    max, cutoff, cutlim;
    ngx_uint_t   valid;
    enum {
        st_start = 0,
        st_year,
        st_month,
        st_week,
        st_day,
        st_hour,
        st_min,
        st_sec,
        st_msec,
        st_last
    } step;

    valid = 0;
    value = 0;
    total = 0;
    cutoff = NGX_MAX_INT_T_VALUE / 10;
    cutlim = NGX_MAX_INT_T_VALUE % 10;
    step = is_sec ? st_start : st_month;

    p = line->data;
    last = p + line->len;

    while (p < last) {

        if (*p >= '0' && *p <= '9') {
            if (value >= cutoff && (value > cutoff || *p - '0' > cutlim)) {
                return NGX_ERROR;
            }

            value = value * 10 + (*p++ - '0');
            valid = 1;
            continue;
        }

        switch (*p++) {

        case 'y':
            if (step > st_start) {
                return NGX_ERROR;
            }
            step = st_year;
            max = NGX_MAX_INT_T_VALUE / (60 * 60 * 24 * 365);
            scale = 60 * 60 * 24 * 365;
            break;

        case 'M':
            if (step >= st_month) {
                return NGX_ERROR;
            }
            step = st_month;
            max = NGX_MAX_INT_T_VALUE / (60 * 60 * 24 * 30);
            scale = 60 * 60 * 24 * 30;
            break;

        case 'w':
            if (step >= st_week) {
                return NGX_ERROR;
            }
            step = st_week;
            max = NGX_MAX_INT_T_VALUE / (60 * 60 * 24 * 7);
            scale = 60 * 60 * 24 * 7;
            break;

        case 'd':
            if (step >= st_day) {
                return NGX_ERROR;
            }
            step = st_day;
            max = NGX_MAX_INT_T_VALUE / (60 * 60 * 24);
            scale = 60 * 60 * 24;
            break;

        case 'h':
            if (step >= st_hour) {
                return NGX_ERROR;
            }
            step = st_hour;
            max = NGX_MAX_INT_T_VALUE / (60 * 60);
            scale = 60 * 60;
            break;

        case 'm':
            if (p < last && *p == 's') {
                if (is_sec || step >= st_msec) {
                    return NGX_ERROR;
                }
                p++;
                step = st_msec;
                max = NGX_MAX_INT_T_VALUE;
                scale = 1;
                break;
            }

            if (step >= st_min) {
                return NGX_ERROR;
            }
            step = st_min;
            max = NGX_MAX_INT_T_VALUE / 60;
            scale = 60;
            break;

        case 's':
            if (step >= st_sec) {
                return NGX_ERROR;
            }
            step = st_sec;
            max = NGX_MAX_INT_T_VALUE;
            scale = 1;
            break;

        case ' ':
            if (step >= st_sec) {
                return NGX_ERROR;
            }
            step = st_last;
            max = NGX_MAX_INT_T_VALUE;
            scale = 1;
            break;

        default:
            return NGX_ERROR;
        }

        if (step != st_msec && !is_sec) {
            scale *= 1000;
            max /= 1000;
        }

        if (value > max) {
            return NGX_ERROR;
        }

        value *= scale;

        if (total > NGX_MAX_INT_T_VALUE - value) {
            return NGX_ERROR;
        }

        total += value;

        value = 0;

        while (p < last && *p == ' ') {
            p++;
        }
    }

    if (!valid) {
        return NGX_ERROR;
    }

    if (!is_sec) {
        if (value > NGX_MAX_INT_T_VALUE / 1000) {
            return NGX_ERROR;
        }

        value *= 1000;
    }

    if (total > NGX_MAX_INT_T_VALUE - value) {
        return NGX_ERROR;
    }

    return total + value;
}